

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool Js::JavascriptArray::Jit_TryGetArrayForObjectWithArray
               (Var var,bool *isObjectWithArrayRef,INT_PTR *pVTable,JavascriptArray **pArray)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *this;
  ArrayObject *obj;
  INT_PTR IVar4;
  JavascriptArray *local_40;
  ArrayObject *objectArray;
  JavascriptArray **pArray_local;
  INT_PTR *pVTable_local;
  bool *isObjectWithArrayRef_local;
  Var var_local;
  
  if (isObjectWithArrayRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27d,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pVTable == (INT_PTR *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27e,"(pVTable)","pVTable");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pArray == (JavascriptArray **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x27f,"(pArray)","pArray");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*pVTable == VirtualTableInfo<Js::DynamicObject>::Address) ||
     (*pVTable == VirtualTableInfo<Js::CrossSiteObject<Js::DynamicObject>_>::Address)) {
    this = VarTo<Js::DynamicObject>(var);
    obj = DynamicObject::GetObjectArray(this);
    if ((obj == (ArrayObject *)0x0) ||
       (bVar2 = VarIs<Js::JavascriptArray,Js::ArrayObject>(obj), !bVar2)) {
      local_40 = (JavascriptArray *)0x0;
    }
    else {
      local_40 = VarTo<Js::JavascriptArray,Js::ArrayObject>(obj);
    }
    *pArray = local_40;
    if (*pArray == (JavascriptArray *)0x0) {
      return false;
    }
    *isObjectWithArrayRef = true;
    IVar4 = VirtualTableInfoBase::GetVirtualTable(*pArray);
    *pVTable = IVar4;
  }
  return true;
}

Assistant:

bool JavascriptArray::Jit_TryGetArrayForObjectWithArray(const Var var, bool *const isObjectWithArrayRef, INT_PTR* pVTable, JavascriptArray** pArray)
    {
        Assert(isObjectWithArrayRef);
        Assert(pVTable);
        Assert(pArray);

        if (*pVTable == VirtualTableInfo<DynamicObject>::Address ||
            *pVTable == VirtualTableInfo<CrossSiteObject<DynamicObject>>::Address)
        {
            ArrayObject* objectArray = VarTo<DynamicObject>(var)->GetObjectArray();
            *pArray = (objectArray && VarIs<JavascriptArray>(objectArray)) ? VarTo<JavascriptArray>(objectArray) : nullptr;
            if (!(*pArray))
            {
                return false;
            }
            *isObjectWithArrayRef = true;
            *pVTable = VirtualTableInfoBase::GetVirtualTable(*pArray);
        }
        return true;
    }